

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O1

void __thiscall
flatbuffers::IdlNamer::IdlNamer
          (IdlNamer *this,Config *config,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywords)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *p_Var3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_198;
  Config local_168;
  
  Namer::Config::Config(&local_168,config);
  p_Var2 = &_Stack_198._M_impl.super__Rb_tree_header;
  _Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent =
       (keywords->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (_Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var3 = &_Stack_198._M_impl;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  else {
    p_Var1 = &(keywords->_M_t)._M_impl.super__Rb_tree_header;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_color =
         (keywords->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_left =
         (keywords->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_right =
         (keywords->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
    p_Var3 = &(keywords->_M_t)._M_impl;
    _Stack_198._M_impl.super__Rb_tree_header._M_node_count =
         (keywords->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    (keywords->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (keywords->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (keywords->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (p_Var3->super__Rb_tree_header)._M_node_count = 0;
  (this->super_Namer)._vptr_Namer = (_func_int **)&PTR__Namer_003f2d00;
  Namer::Config::Config(&(this->super_Namer).config_,&local_168);
  p_Var1 = &(this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header;
  if (_Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    psVar4 = &(this->super_Namer).keywords_;
  }
  else {
    psVar4 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&_Stack_198;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_198._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_198._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_198._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (this->super_Namer).keywords_._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_198._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    _Stack_198._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_198);
  Namer::Config::~Config(&local_168);
  (this->super_Namer)._vptr_Namer = (_func_int **)&PTR__Namer_003f2c10;
  return;
}

Assistant:

explicit IdlNamer(Config config, std::set<std::string> keywords)
      : Namer(config, std::move(keywords)) {}